

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsElfFile.cpp
# Opt level: O0

bool __thiscall MipsElfFile::seekPhysical(MipsElfFile *this,int64_t physicalAddress)

{
  Elf32_Off EVar1;
  Elf32_Word EVar2;
  ElfSegment *pEVar3;
  ulong uVar4;
  ElfSection *pEVar5;
  long lVar6;
  int64_t sectEnd_1;
  int64_t sectStart_1;
  ElfSection *sect_1;
  size_t i_1;
  int64_t sectEnd;
  int64_t sectStart;
  ElfSection *sect;
  size_t l;
  int64_t segEnd;
  int64_t segStart;
  ElfSegment *seg;
  size_t i;
  int64_t physicalAddress_local;
  MipsElfFile *this_local;
  
  seg = (ElfSegment *)0x0;
  while( true ) {
    pEVar3 = (ElfSegment *)ElfFile::getSegmentCount(&this->elf);
    if (pEVar3 <= seg) {
      sect_1 = (ElfSection *)0x0;
      while( true ) {
        pEVar5 = (ElfSection *)ElfFile::getSegmentlessSectionCount(&this->elf);
        if (pEVar5 <= sect_1) {
          this->segment = -1;
          this->section = -1;
          Logger::queueError<>(Error,"Couldn\'t find a section");
          return false;
        }
        pEVar5 = ElfFile::getSegmentlessSection(&this->elf,(size_t)sect_1);
        EVar1 = ElfSection::getOffset(pEVar5);
        uVar4 = (ulong)EVar1;
        EVar2 = ElfSection::getSize(pEVar5);
        if (((long)uVar4 <= physicalAddress) && (physicalAddress < (long)(uVar4 + EVar2))) break;
        sect_1 = (ElfSection *)((long)&(sect_1->header).sh_name + 1);
      }
      this->segment = -1;
      this->section = (int)sect_1;
      this->sectionOffset = physicalAddress - uVar4;
      return true;
    }
    pEVar3 = ElfFile::getSegment(&this->elf,(size_t)seg);
    EVar1 = ElfSegment::getOffset(pEVar3);
    uVar4 = (ulong)EVar1;
    EVar2 = ElfSegment::getPhysSize(pEVar3);
    if (((long)uVar4 <= physicalAddress) && (physicalAddress < (long)(uVar4 + EVar2))) break;
    seg = (ElfSegment *)((long)&(seg->header).p_type + 1);
  }
  sect = (ElfSection *)0x0;
  while( true ) {
    pEVar5 = (ElfSection *)ElfSegment::getSectionCount(pEVar3);
    if (pEVar5 <= sect) {
      Logger::queueError<>(Error,"Found segment, but no containing section");
      return false;
    }
    pEVar5 = ElfSegment::getSection(pEVar3,(size_t)sect);
    EVar1 = ElfSection::getOffset(pEVar5);
    lVar6 = uVar4 + EVar1;
    EVar2 = ElfSection::getSize(pEVar5);
    if ((lVar6 <= physicalAddress) && (physicalAddress < (long)(lVar6 + (ulong)EVar2))) break;
    sect = (ElfSection *)((long)&(sect->header).sh_name + 1);
  }
  this->segment = (int)seg;
  this->section = (int)sect;
  this->sectionOffset = physicalAddress - lVar6;
  return true;
}

Assistant:

bool MipsElfFile::seekPhysical(int64_t physicalAddress)
{
	// search in segments
	for (size_t i = 0; i < elf.getSegmentCount(); i++)
	{
		ElfSegment* seg = elf.getSegment(i);
		int64_t segStart = seg->getOffset();
		int64_t segEnd = segStart+seg->getPhysSize();

		if (segStart <= physicalAddress && physicalAddress < segEnd)
		{
			// find section
			for (size_t l = 0; l < seg->getSectionCount(); l++)
			{
				ElfSection* sect = seg->getSection(l);
				int64_t sectStart = segStart+sect->getOffset();
				int64_t sectEnd = sectStart+sect->getSize();
				
				if (sectStart <= physicalAddress && physicalAddress < sectEnd)
				{
					segment = (int) i;
					section = (int) l;
					sectionOffset = physicalAddress-sectStart;
					return true;
				}
			}

			Logger::queueError(Logger::Error, "Found segment, but no containing section");
			return false;
		}
	}

	// search in segmentless sections
	for (size_t i = 0; i < elf.getSegmentlessSectionCount(); i++)
	{
		ElfSection* sect = elf.getSegmentlessSection(i);
		int64_t sectStart = sect->getOffset();
		int64_t sectEnd = sectStart+sect->getSize();
		
		if (sectStart <= physicalAddress && physicalAddress < sectEnd)
		{
			segment = -1;
			section = (int) i;
			sectionOffset = physicalAddress-sectStart;
			return true;
		}
	}

	segment = -1;
	section = -1;
	Logger::queueError(Logger::Error, "Couldn't find a section");
	return false;
}